

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpStateFront,VkStencilOpState *stencilOpStateBack)

{
  string *psVar1;
  ostringstream desc;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"\nFront faces:\n",0xe);
  ::vk::operator<<((ostream *)aoStack_198,(VkStencilOpState *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"Back faces:\n",0xc);
  ::vk::operator<<((ostream *)aoStack_198,stencilOpStateFront);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  psVar1 = (string *)std::ios_base::~ios_base(local_128);
  return psVar1;
}

Assistant:

std::string getStencilStateSetDescription(const VkStencilOpState& stencilOpStateFront,
										  const VkStencilOpState& stencilOpStateBack)
{
	std::ostringstream desc;

	desc << "\nFront faces:\n" << stencilOpStateFront;
	desc << "Back faces:\n" << stencilOpStateBack;

	return desc.str();
}